

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O1

bool __thiscall QFontDef::operator==(QFontDef *this,QFontDef *other)

{
  long lVar1;
  long lVar2;
  compare_eq_result_container<QList<QString>,_QString> cVar3;
  char cVar4;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  if (((this->pixelSize == other->pixelSize) && (!NAN(this->pixelSize) && !NAN(other->pixelSize)))
     && (((*(ulong *)&other->field_0x60 ^ *(ulong *)&this->field_0x60) & 0xfffff3fffffff) == 0)) {
    cVar3 = QList<QString>::operator==(&this->families,&other->families);
    if (cVar3) {
      lVar1 = (this->styleName).d.size;
      lVar2 = (other->styleName).d.size;
      if (lVar1 == lVar2) {
        QVar6.m_data = (this->styleName).d.ptr;
        QVar6.m_size = lVar1;
        QVar7.m_data = (other->styleName).d.ptr;
        QVar7.m_size = lVar2;
        cVar4 = QtPrivate::equalStrings(QVar6,QVar7);
        if ((cVar4 != '\0') &&
           (((*(uint *)&other->field_0x60 ^ *(uint *)&this->field_0x60) & 0xc0000000) == 0)) {
          bVar5 = comparesEqual<QFont::Tag,_float,_true>
                            (&this->variableAxisValues,&other->variableAxisValues);
          return bVar5;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const QFontDef &other) const
    {
        return pixelSize == other.pixelSize
                    && weight == other.weight
                    && style == other.style
                    && stretch == other.stretch
                    && styleHint == other.styleHint
                    && styleStrategy == other.styleStrategy
                    && ignorePitch == other.ignorePitch && fixedPitch == other.fixedPitch
                    && families == other.families
                    && styleName == other.styleName
                    && hintingPreference == other.hintingPreference
                    && variableAxisValues == other.variableAxisValues
                          ;
    }